

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O0

void __thiscall SQObjectPtr::Null(SQObjectPtr *this)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  uint *in_RDI;
  SQObjectValue unOldVal;
  SQObjectType tOldType;
  
  uVar1 = *in_RDI;
  plVar2 = *(long **)(in_RDI + 2);
  *in_RDI = 0x1000001;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  if ((uVar1 & 0x8000000) != 0) {
    lVar3 = plVar2[1];
    plVar2[1] = lVar3 + -1;
    if (lVar3 + -1 == 0) {
      (**(code **)(*plVar2 + 0x10))();
    }
  }
  return;
}

Assistant:

inline void Null()
    {
        SQObjectType tOldType = _type;
        SQObjectValue unOldVal = _unVal;
        _type = OT_NULL;
        _unVal.raw = (SQRawObjectVal)NULL;
        __Release(tOldType ,unOldVal);
    }